

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O0

void __thiscall QPainter::setWorldMatrixEnabled(QPainter *this,bool enable)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  QPainterPrivate *pQVar5;
  pointer pQVar6;
  byte in_SIL;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QPainterPrivate *d;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined7 in_stack_ffffffffffffffc8;
  char local_28 [32];
  long local_8;
  int line;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_SIL & 1;
  pQVar5 = d_func((QPainter *)0x596e6e);
  line = (int)((ulong)pQVar5 >> 0x20);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor> *)0x596e84);
  if (bVar2) {
    uVar4 = (uint)(bVar1 & 1);
    pQVar6 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                       ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x596ecb);
    if (uVar4 != (pQVar6->field_0x1a0 & 1)) {
      bVar3 = bVar1 & 1;
      pQVar6 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                         ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x596efe
                         );
      pQVar6->field_0x1a0 = pQVar6->field_0x1a0 & 0xfe | bVar3 & 1;
      QPainterPrivate::updateMatrix((QPainterPrivate *)CONCAT17(bVar1,in_stack_ffffffffffffffc8));
    }
  }
  else {
    QMessageLogger::QMessageLogger
              (in_RDI,(char *)CONCAT17(bVar1,in_stack_ffffffffffffffc8),line,
               (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    QMessageLogger::warning(local_28,"QPainter::setMatrixEnabled: Painter not active");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPainter::setWorldMatrixEnabled(bool enable)
{
    Q_D(QPainter);
#ifdef QT_DEBUG_DRAW
    if (qt_show_painter_debug_output)
        printf("QPainter::setMatrixEnabled(), enable=%d\n", enable);
#endif

    if (!d->engine) {
        qWarning("QPainter::setMatrixEnabled: Painter not active");
        return;
    }
    if (enable == d->state->WxF)
        return;

    d->state->WxF = enable;
    d->updateMatrix();
}